

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O1

Type * LLVMBC::Type::getIntTy(LLVMContext *context,uint32_t width)

{
  pointer *pppTVar1;
  IntegerType *pIVar2;
  iterator __position;
  bool bVar3;
  bool bVar4;
  pointer ppTVar5;
  IntegerType *unaff_R14;
  uint32_t local_1c;
  IntegerType *local_18;
  
  for (ppTVar5 = (context->type_cache).
                 super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      bVar4 = ppTVar5 ==
              (context->type_cache).
              super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
              _M_impl.super__Vector_impl_data._M_finish, !bVar4; ppTVar5 = ppTVar5 + 1) {
    pIVar2 = (IntegerType *)*ppTVar5;
    if (((pIVar2->super_Type).type_id == IntegerTyID) && (pIVar2->width == width)) {
      bVar3 = false;
      unaff_R14 = pIVar2;
    }
    else {
      bVar3 = true;
    }
    if (!bVar3) break;
  }
  if (bVar4) {
    local_1c = width;
    unaff_R14 = LLVMContext::construct<LLVMBC::IntegerType,LLVMBC::LLVMContext&,unsigned_int&>
                          (context,context,&local_1c);
    __position._M_current =
         (context->type_cache).
         super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (context->type_cache).
        super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_18 = unaff_R14;
      std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
      _M_realloc_insert<LLVMBC::Type*>
                ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)
                 &context->type_cache,__position,(Type **)&local_18);
    }
    else {
      *__position._M_current = &unaff_R14->super_Type;
      pppTVar1 = &(context->type_cache).
                  super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  return &unaff_R14->super_Type;
}

Assistant:

Type *Type::getIntTy(LLVMContext &context, uint32_t width)
{
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
		if (type->getTypeID() == TypeID::IntegerTyID && cast<IntegerType>(type)->getBitWidth() == width)
			return type;

	auto *type = context.construct<IntegerType>(context, width);
	cache.push_back(type);
	return type;
}